

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  FieldDescriptor FVar1;
  pointer ppDVar2;
  Descriptor *this_00;
  MessageSCCAnalyzer *this_01;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  MessageAnalysis MVar7;
  pointer prVar8;
  FieldDescriptor *pFVar9;
  Descriptor *descriptor;
  SCC *scc_00;
  MessageAnalysis *pMVar10;
  bool bVar11;
  ulong uVar12;
  bool bVar13;
  int j;
  int index;
  SCC *scc_local;
  undefined8 local_70;
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
  *local_68;
  ulong local_60;
  MessageSCCAnalyzer *local_58;
  iterator it;
  iterator local_40;
  
  scc_local = scc;
  it = absl::lts_20240722::container_internal::
       raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
       ::find<google::protobuf::compiler::SCC_const*>
                 ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                   *)&this->analysis_cache_,&scc_local);
  local_40.ctrl_ = (ctrl_t *)0x0;
  bVar3 = absl::lts_20240722::container_internal::operator!=(&it,&local_40);
  if (bVar3) {
    prVar8 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::iterator::operator->(&it);
    pMVar10 = &prVar8->second;
  }
  else {
    local_68 = (raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                *)&this->analysis_cache_;
    local_58 = this;
    bVar4 = UsingImplicitWeakFields
                      (*(FileDescriptor **)
                        (*(scc_local->descriptors).
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10),&this->options_);
    local_70 = 0;
    bVar11 = false;
    bVar3 = false;
    bVar13 = false;
    uVar12 = 0;
    while (ppDVar2 = (scc_local->descriptors).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(scc_local->descriptors).
                                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3)) {
      this_00 = ppDVar2[uVar12];
      if (0 < *(int *)(this_00 + 0x88)) {
        bVar3 = true;
      }
      local_60 = uVar12;
      for (index = 0; index < *(int *)(this_00 + 4); index = index + 1) {
        pFVar9 = Descriptor::field(this_00,index);
        cVar5 = google::protobuf::FieldDescriptor::is_required();
        if (cVar5 != '\0') {
          bVar13 = true;
        }
        if (*(char *)(*(long *)(pFVar9 + 0x38) + 0x8c) != '\0') {
          bVar4 = true;
        }
        FVar1 = pFVar9[2];
        if ((byte)FVar1 - 10 < 2) {
          descriptor = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
          this_01 = local_58;
          scc_00 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                   GetSCC(&local_58->analyzer_,descriptor);
          if (scc_00 == scc_local) {
            local_70 = CONCAT71((int7)((ulong)scc_00 >> 8),1);
          }
          else {
            MVar7 = GetSCCAnalysis(this_01,scc_00);
            bVar11 = (bool)(MVar7.contains_cord & 1U | bVar11);
            bVar3 = (bool)(MVar7.contains_extension & 1U | bVar3);
            bVar13 = (bool)(MVar7.contains_required & 1U | bVar13);
            bVar4 = (bool)(MVar7.contains_weak & 1U | bVar4);
          }
        }
        else if (((FVar1 == (FieldDescriptor)0xc) || (FVar1 == (FieldDescriptor)0x9)) &&
                (iVar6 = google::protobuf::FieldDescriptor::cpp_string_type(), iVar6 == 2)) {
          bVar11 = true;
        }
      }
      uVar12 = local_60 + 1;
    }
    pMVar10 = absl::lts_20240722::container_internal::
              raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
              ::
              operator[]<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>>
                        (local_68,&scc_local);
    pMVar10->is_recursive = SUB81(local_70,0);
    pMVar10->contains_cord = bVar11;
    pMVar10->contains_extension = bVar3;
    pMVar10->contains_required = bVar13;
    pMVar10->contains_weak = bVar4;
  }
  return *pMVar10;
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  auto it = analysis_cache_.find(scc);
  if (it != analysis_cache_.end()) return it->second;

  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (size_t i = 0; i < scc->descriptors.size(); ++i) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->cpp_string_type() ==
              FieldDescriptor::CppStringType::kCord) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = std::move(result);
}